

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2NeverNewline(void)

{
  char *pcVar1;
  char *__s;
  bool bVar2;
  undefined4 uVar3;
  long lVar5;
  StringPiece m;
  Options opt;
  RE2 re;
  StringPiece local_2d0;
  Arg *local_2c0;
  Arg local_2b8;
  Options local_2a8;
  char *local_290;
  ostream local_288 [376];
  RE2 local_110;
  size_t sVar4;
  
  local_2a8.encoding_ = EncodingUTF8;
  local_2a8.posix_syntax_ = false;
  local_2a8.longest_match_ = false;
  local_2a8.log_errors_ = true;
  local_2a8.max_mem_ = 0x800000;
  local_2a8.literal_ = false;
  local_2a8.never_nl_ = true;
  local_2a8.dot_nl_ = false;
  local_2a8.never_capture_ = false;
  local_2a8.case_sensitive_ = true;
  local_2a8.perl_classes_ = false;
  local_2a8.word_boundary_ = false;
  local_2a8.one_line_ = false;
  lVar5 = 0;
  do {
    local_290 = *(char **)((long)&never_tests + lVar5);
    uVar3._0_1_ = (ostringstream)0x0;
    uVar3._1_3_ = 0;
    if (local_290 != (char *)0x0) {
      sVar4 = strlen(local_290);
      uVar3 = (undefined4)sVar4;
    }
    local_288._0_4_ = uVar3;
    RE2::RE2(&local_110,(StringPiece *)&local_290,&local_2a8);
    pcVar1 = *(char **)((long)&DAT_0016a2c0 + lVar5);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = *(char **)((long)&PTR_anon_var_dwarf_342b2_0016a2b8 + lVar5);
      if (pcVar1 == (char *)0x0) {
        local_288[0] = (ostringstream)0x0;
        local_288._1_3_ = 0;
      }
      else {
        sVar4 = strlen(pcVar1);
        local_288._0_4_ = (undefined4)sVar4;
      }
      local_290 = pcVar1;
      bVar2 = RE2::PartialMatchN((StringPiece *)&local_290,&local_110,(Arg **)0x0,0);
      if (bVar2) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x525,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_288,"Check failed: !(re.PartialMatch(t.text, re))",0x2c);
        goto LAB_00129bcc;
      }
    }
    else {
      local_2d0.ptr_ = (char *)0x0;
      local_2d0.length_ = 0;
      __s = *(char **)((long)&PTR_anon_var_dwarf_342b2_0016a2b8 + lVar5);
      if (__s == (char *)0x0) {
        local_288[0] = (ostringstream)0x0;
        local_288._1_3_ = 0;
      }
      else {
        sVar4 = strlen(__s);
        local_288._0_4_ = (undefined4)sVar4;
      }
      local_2b8.arg_ = &local_2d0;
      local_2b8.parser_ = RE2::Arg::parse_stringpiece;
      local_2c0 = &local_2b8;
      local_290 = __s;
      bVar2 = RE2::PartialMatchN((StringPiece *)&local_290,&local_110,&local_2c0,1);
      if (!bVar2) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x528,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_288,"Check failed: re.PartialMatch(t.text, re, &m)",0x2d);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
      }
      local_290 = pcVar1;
      sVar4 = strlen(pcVar1);
      local_288._0_4_ = (undefined4)sVar4;
      bVar2 = StringPiece::_equal(&local_2d0,(StringPiece *)&local_290);
      if (!bVar2) {
        LogMessage::LogMessage
                  ((LogMessage *)&local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                   ,0x529,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_288,"Check failed: (m) == (t.match)",0x1e);
LAB_00129bcc:
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_290);
      }
    }
    RE2::~RE2(&local_110);
    lVar5 = lVar5 + 0x18;
    if (lVar5 == 0x78) {
      return;
    }
  } while( true );
}

Assistant:

TEST(RE2, NeverNewline) {
  RE2::Options opt;
  opt.set_never_nl(true);
  for (int i = 0; i < arraysize(never_tests); i++) {
    const NeverTest& t = never_tests[i];
    RE2 re(t.regexp, opt);
    if (t.match == NULL) {
      EXPECT_FALSE(re.PartialMatch(t.text, re));
    } else {
      StringPiece m;
      EXPECT_TRUE(re.PartialMatch(t.text, re, &m));
      EXPECT_EQ(m, t.match);
    }
  }
}